

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall QTableModel::insertRows(QTableModel *this,int row,int count,QModelIndex *param_4)

{
  long n;
  qsizetype qVar1;
  int in_EDX;
  int in_ESI;
  QList<QTableWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  int cc;
  int rc;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  parameter_type in_stack_ffffffffffffff90;
  QTableModel *this_00;
  QList<QTableWidgetItem_*> *in_stack_ffffffffffffffa8;
  bool local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_EDX) && (-1 < in_ESI)) {
    n = (long)in_ESI;
    qVar1 = QList<QTableWidgetItem_*>::size(in_RDI + 2);
    if (n <= qVar1) {
      QModelIndex::QModelIndex((QModelIndex *)0x8d3ed9);
      QAbstractItemModel::beginInsertRows((QModelIndex *)in_RDI,(int)local_20,in_ESI);
      qVar1 = QList<QTableWidgetItem_*>::size(in_RDI + 2);
      QList<QTableWidgetItem_*>::size(in_RDI + 3);
      QList<QTableWidgetItem_*>::insert
                (in_stack_ffffffffffffffa8,(qsizetype)in_RDI,n,in_stack_ffffffffffffff90);
      if ((int)qVar1 == 0) {
        QList<QTableWidgetItem_*>::resize(in_RDI,n);
      }
      else {
        this_00 = (QTableModel *)(in_RDI + 1);
        tableIndex(this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        QList<QTableWidgetItem_*>::insert
                  (in_stack_ffffffffffffffa8,(qsizetype)in_RDI,n,(parameter_type)this_00);
      }
      QAbstractItemModel::endInsertRows();
      local_21 = true;
      goto LAB_008d3fac;
    }
  }
  local_21 = false;
LAB_008d3fac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::insertRows(int row, int count, const QModelIndex &)
{
    if (count < 1 || row < 0 || row > verticalHeaderItems.size())
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);
    int rc = verticalHeaderItems.size();
    int cc = horizontalHeaderItems.size();
    verticalHeaderItems.insert(row, count, 0);
    if (rc == 0)
        tableItems.resize(cc * count);
    else
        tableItems.insert(tableIndex(row, 0), cc * count, 0);
    endInsertRows();
    return true;
}